

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void * mwMark(void *p,char *desc,char *file,uint line)

{
  char *__src;
  int iVar1;
  int iVar2;
  mwMarker **ppmVar3;
  size_t sVar4;
  char *pcVar5;
  mwMarker *pmVar6;
  char wherebuf [128];
  mwMarker *local_c0;
  char local_b8 [127];
  undefined1 local_39;
  
  if (mwInited == 0) {
    mwUseAtexit = 1;
    mwInit();
  }
  if (mwTestAlways != 0) {
    mwTestNow((char *)0x0,0,1);
  }
  if (desc == (char *)0x0) {
    desc = "unknown";
  }
  if (file == (char *)0x0) {
    file = "unknown";
  }
  iVar1 = sprintf(local_b8,"%.48s called from %s(%d)",desc,file,(ulong)line);
  if (0x7f < iVar1) {
    local_39 = 0;
  }
  if (p == (void *)0x0) {
    mwWrite("mark: %s(%d), no mark for NULL:\'%s\' may be set\n",file,(ulong)line,desc);
  }
  else {
    if ((mwFirstMark == (mwMarker *)0x0) || (iVar2 = mwIsReadAddr(mwFirstMark,0x20), iVar2 != 0)) {
      ppmVar3 = &mwFirstMark;
      do {
        pmVar6 = *ppmVar3;
        if (pmVar6 == (mwMarker *)0x0) {
          local_c0 = (mwMarker *)malloc(0x20);
          if (local_c0 == (mwMarker *)0x0) goto LAB_001073c4;
          local_c0->next = (mwMarker *)0x0;
          iVar2 = 0;
          goto LAB_001072e8;
        }
        if ((pmVar6->next != (mwMarker *)0x0) &&
           (iVar2 = mwIsReadAddr(pmVar6->next,0x20), iVar2 == 0)) {
          mwWrite("mark: %s(%d), mark(%p)->next(%p) is trashed, can\'t mark for %s\n",file,
                  (ulong)line,pmVar6,pmVar6->next,desc);
          return p;
        }
        ppmVar3 = &pmVar6->next;
      } while (pmVar6->host != p);
      sVar4 = strlen(pmVar6->text);
      iVar2 = (int)sVar4;
      local_c0 = pmVar6;
LAB_001072e8:
      sVar4 = strlen(local_b8);
      iVar2 = (int)sVar4 + iVar2;
      pcVar5 = (char *)malloc((ulong)(iVar2 + 3));
      if (pcVar5 != (char *)0x0) {
        if (pmVar6 == (mwMarker *)0x0) {
          memcpy(pcVar5,local_b8,(ulong)(iVar2 + 1));
          local_c0->next = mwFirstMark;
          local_c0->host = p;
          local_c0->text = pcVar5;
          local_c0->level = 1;
          mwFirstMark = local_c0;
        }
        else {
          __src = local_c0->text;
          strcpy(pcVar5,__src);
          sVar4 = strlen(pcVar5);
          (pcVar5 + sVar4)[0] = ',';
          (pcVar5 + sVar4)[1] = ' ';
          pcVar5[sVar4 + 2] = '\0';
          strcat(pcVar5,local_b8);
          free(__src);
          local_c0->text = pcVar5;
          local_c0->level = local_c0->level + 1;
        }
        if (iVar1 < 0x80) {
          return p;
        }
        mwErrors = mwErrors + 1;
        iVar1 = mwFlushR();
        mwFlushingB2 = iVar1 + 1;
        mwFlushingB1 = mwFlushingB2;
        mwFlushing = mwFlushingB2;
        mwFlush();
        mwTrace(" [WARNING: OUTPUT BUFFER OVERFLOW - SYSTEM UNSTABLE]\n");
        return p;
      }
      if (pmVar6 == (mwMarker *)0x0) {
        free(local_c0);
      }
LAB_001073c4:
      pcVar5 = "mark: %s(%d), no mark for %p:\'%s\', out of memory\n";
      pmVar6 = (mwMarker *)p;
    }
    else {
      pcVar5 = "mark: %s(%d), mwFirstMark (%p) is trashed, can\'t mark for %s\n";
      pmVar6 = mwFirstMark;
    }
    mwWrite(pcVar5,file,(ulong)line,pmVar6,desc);
  }
  return p;
}

Assistant:

void *mwMark(void *p, const char *desc, const char *file, unsigned line)
{
	mwMarker *mrk;
	unsigned n, isnew;
	char *buf;
	int tot, oflow = 0;
	char wherebuf[128];

	mwAutoInit();
	TESTS(NULL, 0);

	if (desc == NULL) {
		desc = "unknown";
	}
	if (file == NULL) {
		file = "unknown";
	}

	tot = sprintf(wherebuf, "%.48s called from %s(%d)", desc, file, line);
	if (tot >= (int)sizeof(wherebuf)) {
		wherebuf[sizeof(wherebuf) - 1] = 0;
		oflow = 1;
	}

	if (p == NULL) {
		mwWrite("mark: %s(%d), no mark for NULL:'%s' may be set\n", file, line, desc);
		return p;
	}

	if (mwFirstMark != NULL && !mwIsReadAddr(mwFirstMark, sizeof(mwMarker))) {
		mwWrite("mark: %s(%d), mwFirstMark (%p) is trashed, can't mark for %s\n",
				file, line, mwFirstMark, desc);
		return p;
	}

	for (mrk = mwFirstMark; mrk; mrk = mrk->next) {
		if (mrk->next != NULL && !mwIsReadAddr(mrk->next, sizeof(mwMarker))) {
			mwWrite("mark: %s(%d), mark(%p)->next(%p) is trashed, can't mark for %s\n",
					file, line, mrk, mrk->next, desc);
			return p;
		}
		if (mrk->host == p) {
			break;
		}
	}

	if (mrk == NULL) {
		isnew = 1;
		mrk = (mwMarker *) malloc(sizeof(mwMarker));
		if (mrk == NULL) {
			mwWrite("mark: %s(%d), no mark for %p:'%s', out of memory\n", file, line, p, desc);
			return p;
		}
		mrk->next = NULL;
		n = 0;
	} else {
		isnew = 0;
		n = strlen(mrk->text);
	}

	n += strlen(wherebuf);
	buf = (char *) malloc(n + 3);
	if (buf == NULL) {
		if (isnew) {
			free(mrk);
		}
		mwWrite("mark: %s(%d), no mark for %p:'%s', out of memory\n", file, line, p, desc);
		return p;
	}

	if (isnew) {
		memcpy(buf, wherebuf, n + 1);
		mrk->next = mwFirstMark;
		mrk->host = p;
		mrk->text = buf;
		mrk->level = 1;
		mwFirstMark = mrk;
	} else {
		strcpy(buf, mrk->text);
		strcat(buf, ", ");
		strcat(buf, wherebuf);
		free(mrk->text);
		mrk->text = buf;
		mrk->level ++;
	}

	if (oflow) {
		mwIncErr();
		mwTrace(" [WARNING: OUTPUT BUFFER OVERFLOW - SYSTEM UNSTABLE]\n");
	}
	return p;
}